

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  _Manager_type local_c8;
  BinaryWriterSpec binary_writer_spec;
  
  local_f8._M_unused._M_object = &out_module_streams;
  local_f8._8_8_ = &log_stream;
  local_e0 = std::
             _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc:660:7)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer-spec.cc:660:7)>
             ::_M_manager;
  std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::function
            ((function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             &local_d8,
             (function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)> *)
             &local_f8);
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&binary_writer_spec,json_stream,(WriteBinarySpecStreamFactory *)&local_d8,
             source_filename,module_filename_noext,options);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript(&binary_writer_spec,script);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec(&binary_writer_spec);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](std::string_view filename) {
        out_module_streams->emplace_back(
            filename, std::make_unique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}